

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixie_provider.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::PixieProvider::PixieProvider
          (PixieProvider *this,UserInfo *user_info)

{
  bool bVar1;
  NameCache *this_00;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  shared_ptr<spdlog::logger> local_60;
  int local_50 [5];
  allocator<char> local_39;
  string local_38;
  UserInfo *local_18;
  UserInfo *user_info_local;
  PixieProvider *this_local;
  
  local_18 = user_info;
  user_info_local = (UserInfo *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"static://highway",&local_39);
  provider::AbstractProvider::AbstractProvider(&this->super_AbstractProvider,user_info,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  (this->super_AbstractProvider).super_Provider.super_Subscriber._vptr_Subscriber =
       (_func_int **)&PTR_Subscribe_003a28e8;
  PixieProtocolOptions::PixieProtocolOptions(&this->protocol_options_);
  std::atomic<int>::atomic(&this->writer_thread_count_,0);
  PriceSyncDecoder::PriceSyncDecoder(&this->price_sync_decoder_);
  std::
  unique_ptr<bidfx_public_api::price::pixie::IDataDictionary,std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>>
  ::unique_ptr<std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>,void>
            ((unique_ptr<bidfx_public_api::price::pixie::IDataDictionary,std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>>
              *)&this->data_dictionary_);
  tools::BlockingQueue<bidfx_public_api::price::pixie::AckData>::BlockingQueue(&this->ack_queue_);
  SubjectSetRegister::SubjectSetRegister(&this->subject_set_register_);
  local_50[0] = 200;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&this->subscription_interval_,local_50);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->last_subscription_check_time_);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->last_write_time_);
  std::atomic<bool>::atomic(&this->disconnection_triggered_,false);
  bVar1 = std::operator==((shared_ptr<spdlog::logger> *)Log,(nullptr_t)0x0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"PixieProvider",&local_81);
    tools::LoggerFactory::GetLogger((LoggerFactory *)&local_60,&local_80);
    std::shared_ptr<spdlog::logger>::operator=((shared_ptr<spdlog::logger> *)Log,&local_60);
    std::shared_ptr<spdlog::logger>::~shared_ptr(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  this->user_info_ = local_18;
  this_00 = tools::NameCache::GetDefault();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"PixieProvider",&local_c9);
  tools::NameCache::CreateUniqueName(&local_a8,this_00,&local_c8);
  std::__cxx11::string::operator=
            ((string *)&(this->super_AbstractProvider).name_,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  return;
}

Assistant:

PixieProvider::PixieProvider(UserInfo* user_info) : AbstractProvider(user_info, "static://highway"), protocol_options_(PixieProtocolOptions())
{
    if (Log == nullptr)
    {
        Log = LoggerFactory::GetLogger("PixieProvider");
    }

    user_info_ = user_info;
    name_ = NameCache::GetDefault().CreateUniqueName("PixieProvider");
}